

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_block_container
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,size_t node,size_t next_level,size_t do_indent)

{
  size_t *psVar1;
  Tree *pTVar2;
  Tree *this_00;
  code *pcVar3;
  Location loc;
  Location loc_00;
  Location LVar4;
  Location loc_01;
  Location LVar5;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location LVar6;
  Location loc_06;
  Location LVar7;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location LVar8;
  long lVar9;
  bool bVar10;
  error_flags eVar11;
  size_t sVar12;
  NodeScalar *pNVar13;
  NodeType NVar14;
  long lVar15;
  char msg [37];
  char local_138 [24];
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined4 uStack_11c;
  undefined2 uStack_118;
  undefined2 uStack_116;
  uint uStack_114;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  size_t local_108;
  long local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  pTVar2 = this->m_tree;
  local_108 = next_level;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_138[0] = '\0';
    local_138[1] = '\0';
    local_138[2] = '\0';
    local_138[3] = '\0';
    local_138[4] = '\0';
    local_138[5] = '\0';
    local_138[6] = '\0';
    local_138[7] = '\0';
    local_138[8] = -0x7a;
    local_138[9] = 'K';
    local_138[10] = '\0';
    local_138[0xb] = '\0';
    local_138[0xc] = '\0';
    local_138[0xd] = '\0';
    local_138[0xe] = '\0';
    local_138[0xf] = '\0';
    local_138[0x10] = '\0';
    local_138[0x11] = '\0';
    local_138[0x12] = '\0';
    local_138[0x13] = '\0';
    local_138[0x14] = '\0';
    local_138[0x15] = '\0';
    local_138[0x16] = '\0';
    local_138[0x17] = '\0';
    uStack_120 = 0xbf6a;
    uStack_11e = 0x1f;
    uStack_11c = 0;
    uStack_118 = 0x65;
    uStack_116 = 0;
    uStack_114 = 0;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str._0_4_ = 0x1fbf6a;
    loc.name.str._4_4_ = 0;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  lVar15 = next_level * do_indent * 2;
  this_00 = this->m_tree;
  if ((pTVar2->m_buf[node].m_type.type & SEQ) == NOTYPE) {
    if ((node == 0xffffffffffffffff) || (this_00->m_cap <= node)) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_138[0] = '\0';
      local_138[1] = '\0';
      local_138[2] = '\0';
      local_138[3] = '\0';
      local_138[4] = '\0';
      local_138[5] = '\0';
      local_138[6] = '\0';
      local_138[7] = '\0';
      local_138[8] = -0x7a;
      local_138[9] = 'K';
      local_138[10] = '\0';
      local_138[0xb] = '\0';
      local_138[0xc] = '\0';
      local_138[0xd] = '\0';
      local_138[0xe] = '\0';
      local_138[0xf] = '\0';
      local_138[0x10] = '\0';
      local_138[0x11] = '\0';
      local_138[0x12] = '\0';
      local_138[0x13] = '\0';
      local_138[0x14] = '\0';
      local_138[0x15] = '\0';
      local_138[0x16] = '\0';
      local_138[0x17] = '\0';
      uStack_120 = 0xbf6a;
      uStack_11e = 0x1f;
      uStack_11c = 0;
      uStack_118 = 0x65;
      uStack_116 = 0;
      uStack_114 = 0;
      loc_00.super_LineCol.col = 0;
      loc_00.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_00.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_00.name.str._0_4_ = 0x1fbf6a;
      loc_00.name.str._4_4_ = 0;
      loc_00.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_00);
    }
    if ((this_00->m_buf[node].m_type.type & MAP) == NOTYPE) {
      builtin_strncpy(local_138 + 0x10,"_tree->i",8);
      uStack_120 = 0x5f73;
      uStack_11e = 0x616d;
      builtin_strncpy(local_138,"check failed: (m",0x10);
      uStack_11c = 0x6f6e2870;
      uStack_118 = 0x6564;
      uStack_116 = 0x2929;
      uStack_114 = uStack_114 & 0xffffff00;
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8 = 0;
      uStack_a0 = 0x5953;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5953) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x5953) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_tree->m_callbacks).m_error)
                (local_138,0x25,LVar4,(this->m_tree->m_callbacks).m_user_data);
    }
    sVar12 = Tree::first_child(this->m_tree,node);
    if (sVar12 != 0xffffffffffffffff) {
      local_100 = local_108 * 2;
      do {
        pTVar2 = this->m_tree;
        if (pTVar2->m_cap <= sVar12) {
          eVar11 = get_error_flags();
          if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_138[0] = '\0';
          local_138[1] = '\0';
          local_138[2] = '\0';
          local_138[3] = '\0';
          local_138[4] = '\0';
          local_138[5] = '\0';
          local_138[6] = '\0';
          local_138[7] = '\0';
          local_138[8] = -0x7a;
          local_138[9] = 'K';
          local_138[10] = '\0';
          local_138[0xb] = '\0';
          local_138[0xc] = '\0';
          local_138[0xd] = '\0';
          local_138[0xe] = '\0';
          local_138[0xf] = '\0';
          local_138[0x10] = '\0';
          local_138[0x11] = '\0';
          local_138[0x12] = '\0';
          local_138[0x13] = '\0';
          local_138[0x14] = '\0';
          local_138[0x15] = '\0';
          local_138[0x16] = '\0';
          local_138[0x17] = '\0';
          uStack_120 = 0xbf6a;
          uStack_11e = 0x1f;
          uStack_11c = 0;
          uStack_118 = 0x65;
          uStack_116 = 0;
          uStack_114 = 0;
          loc_01.super_LineCol.col = 0;
          loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_01.name.str._0_4_ = 0x1fbf6a;
          loc_01.name.str._4_4_ = 0;
          loc_01.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
        }
        if ((pTVar2->m_buf[sVar12].m_type.type & KEY) == NOTYPE) {
          builtin_strncpy(local_138 + 0x10,"_tree->h",8);
          uStack_120 = 0x7361;
          uStack_11e = 0x6b5f;
          builtin_strncpy(local_138,"check failed: (m",0x10);
          uStack_11c = 0x69287965;
          uStack_118 = 0x6863;
          uStack_116 = 0x2929;
          uStack_114 = uStack_114 & 0xffffff00;
          eVar11 = get_error_flags();
          if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_d0 = 0;
          uStack_c8 = 0x5956;
          local_c0 = 0;
          pcStack_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b0 = 0x65;
          LVar5.super_LineCol.col = 0;
          LVar5.super_LineCol.offset = SUB168(ZEXT816(0x5956) << 0x40,0);
          LVar5.super_LineCol.line = SUB168(ZEXT816(0x5956) << 0x40,8);
          LVar5.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar5.name.len = 0x65;
          (*(this->m_tree->m_callbacks).m_error)
                    (local_138,0x25,LVar5,(this->m_tree->m_callbacks).m_user_data);
        }
        pTVar2 = this->m_tree;
        if (pTVar2->m_cap <= sVar12) {
          eVar11 = get_error_flags();
          if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_138[0] = '\0';
          local_138[1] = '\0';
          local_138[2] = '\0';
          local_138[3] = '\0';
          local_138[4] = '\0';
          local_138[5] = '\0';
          local_138[6] = '\0';
          local_138[7] = '\0';
          local_138[8] = -0x7a;
          local_138[9] = 'K';
          local_138[10] = '\0';
          local_138[0xb] = '\0';
          local_138[0xc] = '\0';
          local_138[0xd] = '\0';
          local_138[0xe] = '\0';
          local_138[0xf] = '\0';
          local_138[0x10] = '\0';
          local_138[0x11] = '\0';
          local_138[0x12] = '\0';
          local_138[0x13] = '\0';
          local_138[0x14] = '\0';
          local_138[0x15] = '\0';
          local_138[0x16] = '\0';
          local_138[0x17] = '\0';
          uStack_120 = 0xbf6a;
          uStack_11e = 0x1f;
          uStack_11c = 0;
          uStack_118 = 0x65;
          uStack_116 = 0;
          uStack_114 = 0;
          loc_02.super_LineCol.col = 0;
          loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_02.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_02.name.str._0_4_ = 0x1fbf6a;
          loc_02.name.str._4_4_ = 0;
          loc_02.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_02);
        }
        lVar9 = lVar15;
        if ((~(int)pTVar2->m_buf[sVar12].m_type.type & 3U) == 0) {
          for (; lVar9 != 0; lVar9 = lVar9 + -1) {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
          }
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + lVar15;
          pNVar13 = Tree::keysc(this->m_tree,sVar12);
          pTVar2 = this->m_tree;
          if (pTVar2->m_cap <= sVar12) {
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_138[0] = '\0';
            local_138[1] = '\0';
            local_138[2] = '\0';
            local_138[3] = '\0';
            local_138[4] = '\0';
            local_138[5] = '\0';
            local_138[6] = '\0';
            local_138[7] = '\0';
            local_138[8] = -0x7a;
            local_138[9] = 'K';
            local_138[10] = '\0';
            local_138[0xb] = '\0';
            local_138[0xc] = '\0';
            local_138[0xd] = '\0';
            local_138[0xe] = '\0';
            local_138[0xf] = '\0';
            local_138[0x10] = '\0';
            local_138[0x11] = '\0';
            local_138[0x12] = '\0';
            local_138[0x13] = '\0';
            local_138[0x14] = '\0';
            local_138[0x15] = '\0';
            local_138[0x16] = '\0';
            local_138[0x17] = '\0';
            uStack_120 = 0xbf6a;
            uStack_11e = 0x1f;
            uStack_11c = 0;
            uStack_118 = 0x65;
            uStack_116 = 0;
            uStack_114 = 0;
            loc_03.super_LineCol.col = 0;
            loc_03.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
            loc_03.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
            loc_03.name.str._0_4_ = 0x1fbf6a;
            loc_03.name.str._4_4_ = 0;
            loc_03.name.len = 0x65;
            error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_03);
          }
          _write(this,(int)pNVar13,
                 (void *)(ulong)((uint)pTVar2->m_buf[sVar12].m_type.type & 0x2aa2142),local_108);
          std::ostream::write((char *)((this->
                                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).m_stream + 0x10),0x1fcf29);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 2;
          pNVar13 = Tree::valsc(this->m_tree,sVar12);
          pTVar2 = this->m_tree;
          if (pTVar2->m_cap <= sVar12) {
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_138[0] = '\0';
            local_138[1] = '\0';
            local_138[2] = '\0';
            local_138[3] = '\0';
            local_138[4] = '\0';
            local_138[5] = '\0';
            local_138[6] = '\0';
            local_138[7] = '\0';
            local_138[8] = -0x7a;
            local_138[9] = 'K';
            local_138[10] = '\0';
            local_138[0xb] = '\0';
            local_138[0xc] = '\0';
            local_138[0xd] = '\0';
            local_138[0xe] = '\0';
            local_138[0xf] = '\0';
            local_138[0x10] = '\0';
            local_138[0x11] = '\0';
            local_138[0x12] = '\0';
            local_138[0x13] = '\0';
            local_138[0x14] = '\0';
            local_138[0x15] = '\0';
            local_138[0x16] = '\0';
            local_138[0x17] = '\0';
            uStack_120 = 0xbf6a;
            uStack_11e = 0x1f;
            uStack_11c = 0;
            uStack_118 = 0x65;
            uStack_116 = 0;
            uStack_114 = 0;
            loc_04.super_LineCol.col = 0;
            loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
            loc_04.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
            loc_04.name.str._0_4_ = 0x1fbf6a;
            loc_04.name.str._4_4_ = 0;
            loc_04.name.len = 0x65;
            error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_04);
          }
          _write(this,(int)pNVar13,
                 (void *)(ulong)((uint)pTVar2->m_buf[sVar12].m_type.type & 0x5541281),local_108);
LAB_0018a7ec:
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
        }
        else {
          pTVar2 = this->m_tree;
          if (pTVar2->m_cap <= sVar12) {
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_138[0] = '\0';
            local_138[1] = '\0';
            local_138[2] = '\0';
            local_138[3] = '\0';
            local_138[4] = '\0';
            local_138[5] = '\0';
            local_138[6] = '\0';
            local_138[7] = '\0';
            local_138[8] = -0x7a;
            local_138[9] = 'K';
            local_138[10] = '\0';
            local_138[0xb] = '\0';
            local_138[0xc] = '\0';
            local_138[0xd] = '\0';
            local_138[0xe] = '\0';
            local_138[0xf] = '\0';
            local_138[0x10] = '\0';
            local_138[0x11] = '\0';
            local_138[0x12] = '\0';
            local_138[0x13] = '\0';
            local_138[0x14] = '\0';
            local_138[0x15] = '\0';
            local_138[0x16] = '\0';
            local_138[0x17] = '\0';
            uStack_120 = 0xbf6a;
            uStack_11e = 0x1f;
            uStack_11c = 0;
            uStack_118 = 0x65;
            uStack_116 = 0;
            uStack_114 = 0;
            loc_05.super_LineCol.col = 0;
            loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
            loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
            loc_05.name.str._0_4_ = 0x1fbf6a;
            loc_05.name.str._4_4_ = 0;
            loc_05.name.len = 0x65;
            error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
          }
          if ((pTVar2->m_buf[sVar12].m_type.type & (STREAM|MAP)) == NOTYPE) {
            uStack_118 = 0x656e;
            uStack_116 = 0x2872;
            uStack_114 = 0x29686369;
            uStack_110 = 0x29;
            builtin_strncpy(local_138 + 0x10,"_tree->i",8);
            uStack_120 = 0x5f73;
            uStack_11e = 0x6f63;
            uStack_11c = 0x6961746e;
            builtin_strncpy(local_138,"check failed: (m",0x10);
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = 0;
            uStack_f0 = 0x5961;
            local_e8 = 0;
            pcStack_e0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_d8 = 0x65;
            LVar6.super_LineCol.col = 0;
            LVar6.super_LineCol.offset = SUB168(ZEXT816(0x5961) << 0x40,0);
            LVar6.super_LineCol.line = SUB168(ZEXT816(0x5961) << 0x40,8);
            LVar6.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar6.name.len = 0x65;
            (*(this->m_tree->m_callbacks).m_error)
                      (local_138,0x2a,LVar6,(this->m_tree->m_callbacks).m_user_data);
          }
          NVar14 = Tree::type(this->m_tree,sVar12);
          if (((uint)NVar14.type >> 0xe & 1) != 0) {
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              std::ostream::put((char)(this->
                                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream + '\x10');
            }
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + lVar15;
            _do_visit_flow_sl(this,sVar12,0);
            goto LAB_0018a7ec;
          }
          if ((short)NVar14.type < 0) {
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              std::ostream::put((char)(this->
                                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream + '\x10');
            }
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + lVar15;
            _do_visit_flow_ml(this,sVar12,0,1);
            goto LAB_0018a7ec;
          }
          _do_visit_block(this,sVar12,local_108,do_indent);
        }
        sVar12 = Tree::next_sibling(this->m_tree,sVar12);
        do_indent = 1;
        lVar15 = local_100;
      } while (sVar12 != 0xffffffffffffffff);
    }
  }
  else {
    sVar12 = Tree::first_child(this_00,node);
    if (sVar12 != 0xffffffffffffffff) {
      local_100 = local_108 * 2;
      do {
        pTVar2 = this->m_tree;
        if (pTVar2->m_cap <= sVar12) {
          eVar11 = get_error_flags();
          if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_138[0] = '\0';
          local_138[1] = '\0';
          local_138[2] = '\0';
          local_138[3] = '\0';
          local_138[4] = '\0';
          local_138[5] = '\0';
          local_138[6] = '\0';
          local_138[7] = '\0';
          local_138[8] = -0x7a;
          local_138[9] = 'K';
          local_138[10] = '\0';
          local_138[0xb] = '\0';
          local_138[0xc] = '\0';
          local_138[0xd] = '\0';
          local_138[0xe] = '\0';
          local_138[0xf] = '\0';
          local_138[0x10] = '\0';
          local_138[0x11] = '\0';
          local_138[0x12] = '\0';
          local_138[0x13] = '\0';
          local_138[0x14] = '\0';
          local_138[0x15] = '\0';
          local_138[0x16] = '\0';
          local_138[0x17] = '\0';
          uStack_120 = 0xbf6a;
          uStack_11e = 0x1f;
          uStack_11c = 0;
          uStack_118 = 0x65;
          uStack_116 = 0;
          uStack_114 = 0;
          loc_06.super_LineCol.col = 0;
          loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_06.name.str._0_4_ = 0x1fbf6a;
          loc_06.name.str._4_4_ = 0;
          loc_06.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
        }
        if ((pTVar2->m_buf[sVar12].m_type.type & KEY) != NOTYPE) {
          builtin_strncpy(local_138 + 0x10,"m_tree->",8);
          uStack_120 = 0x6168;
          uStack_11e = 0x5f73;
          uStack_11c = 0x2879656b;
          builtin_strncpy(local_138,"check failed: (!",0x10);
          uStack_118 = 0x6863;
          uStack_116 = 0x6c69;
          uStack_114 = 0x292964;
          eVar11 = get_error_flags();
          if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_58 = 0;
          uStack_50 = 0x592e;
          local_48 = 0;
          pcStack_40 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_38 = 0x65;
          LVar7.super_LineCol.col = 0;
          LVar7.super_LineCol.offset = SUB168(ZEXT816(0x592e) << 0x40,0);
          LVar7.super_LineCol.line = SUB168(ZEXT816(0x592e) << 0x40,8);
          LVar7.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar7.name.len = 0x65;
          (*(this->m_tree->m_callbacks).m_error)
                    (local_138,0x28,LVar7,(this->m_tree->m_callbacks).m_user_data);
        }
        pTVar2 = this->m_tree;
        if (pTVar2->m_cap <= sVar12) {
          eVar11 = get_error_flags();
          if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_138[0] = '\0';
          local_138[1] = '\0';
          local_138[2] = '\0';
          local_138[3] = '\0';
          local_138[4] = '\0';
          local_138[5] = '\0';
          local_138[6] = '\0';
          local_138[7] = '\0';
          local_138[8] = -0x7a;
          local_138[9] = 'K';
          local_138[10] = '\0';
          local_138[0xb] = '\0';
          local_138[0xc] = '\0';
          local_138[0xd] = '\0';
          local_138[0xe] = '\0';
          local_138[0xf] = '\0';
          local_138[0x10] = '\0';
          local_138[0x11] = '\0';
          local_138[0x12] = '\0';
          local_138[0x13] = '\0';
          local_138[0x14] = '\0';
          local_138[0x15] = '\0';
          local_138[0x16] = '\0';
          local_138[0x17] = '\0';
          uStack_120 = 0xbf6a;
          uStack_11e = 0x1f;
          uStack_11c = 0;
          uStack_118 = 0x65;
          uStack_116 = 0;
          uStack_114 = 0;
          loc_07.super_LineCol.col = 0;
          loc_07.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_07.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_07.name.str._0_4_ = 0x1fbf6a;
          loc_07.name.str._4_4_ = 0;
          loc_07.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_07);
        }
        lVar9 = lVar15;
        if ((pTVar2->m_buf[sVar12].m_type.type & KEYVAL) == VAL) {
          for (; lVar9 != 0; lVar9 = lVar9 + -1) {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
          }
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + lVar15;
          std::ostream::write((char *)((this->
                                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).m_stream + 0x10),0x20fa95);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 2;
          pNVar13 = Tree::valsc(this->m_tree,sVar12);
          pTVar2 = this->m_tree;
          if (pTVar2->m_cap <= sVar12) {
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_138[0] = '\0';
            local_138[1] = '\0';
            local_138[2] = '\0';
            local_138[3] = '\0';
            local_138[4] = '\0';
            local_138[5] = '\0';
            local_138[6] = '\0';
            local_138[7] = '\0';
            local_138[8] = -0x7a;
            local_138[9] = 'K';
            local_138[10] = '\0';
            local_138[0xb] = '\0';
            local_138[0xc] = '\0';
            local_138[0xd] = '\0';
            local_138[0xe] = '\0';
            local_138[0xf] = '\0';
            local_138[0x10] = '\0';
            local_138[0x11] = '\0';
            local_138[0x12] = '\0';
            local_138[0x13] = '\0';
            local_138[0x14] = '\0';
            local_138[0x15] = '\0';
            local_138[0x16] = '\0';
            local_138[0x17] = '\0';
            uStack_120 = 0xbf6a;
            uStack_11e = 0x1f;
            uStack_11c = 0;
            uStack_118 = 0x65;
            uStack_116 = 0;
            uStack_114 = 0;
            loc_08.super_LineCol.col = 0;
            loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
            loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
            loc_08.name.str._0_4_ = 0x1fbf6a;
            loc_08.name.str._4_4_ = 0;
            loc_08.name.len = 0x65;
            error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
          }
          _write(this,(int)pNVar13,
                 (void *)(ulong)((uint)pTVar2->m_buf[sVar12].m_type.type & 0x5541281),local_108);
LAB_0018ace8:
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
        }
        else {
          pTVar2 = this->m_tree;
          if (pTVar2->m_cap <= sVar12) {
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_138[0] = '\0';
            local_138[1] = '\0';
            local_138[2] = '\0';
            local_138[3] = '\0';
            local_138[4] = '\0';
            local_138[5] = '\0';
            local_138[6] = '\0';
            local_138[7] = '\0';
            local_138[8] = -0x7a;
            local_138[9] = 'K';
            local_138[10] = '\0';
            local_138[0xb] = '\0';
            local_138[0xc] = '\0';
            local_138[0xd] = '\0';
            local_138[0xe] = '\0';
            local_138[0xf] = '\0';
            local_138[0x10] = '\0';
            local_138[0x11] = '\0';
            local_138[0x12] = '\0';
            local_138[0x13] = '\0';
            local_138[0x14] = '\0';
            local_138[0x15] = '\0';
            local_138[0x16] = '\0';
            local_138[0x17] = '\0';
            uStack_120 = 0xbf6a;
            uStack_11e = 0x1f;
            uStack_11c = 0;
            uStack_118 = 0x65;
            uStack_116 = 0;
            uStack_114 = 0;
            loc_09.super_LineCol.col = 0;
            loc_09.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
            loc_09.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
            loc_09.name.str._0_4_ = 0x1fbf6a;
            loc_09.name.str._4_4_ = 0;
            loc_09.name.len = 0x65;
            error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_09);
          }
          if ((pTVar2->m_buf[sVar12].m_type.type & (STREAM|MAP)) == NOTYPE) {
            uStack_118 = 0x656e;
            uStack_116 = 0x2872;
            uStack_114 = 0x6c696863;
            uStack_110 = 0x2964;
            uStack_10e = 0x29;
            builtin_strncpy(local_138 + 0x10,"_tree->i",8);
            uStack_120 = 0x5f73;
            uStack_11e = 0x6f63;
            uStack_11c = 0x6961746e;
            builtin_strncpy(local_138,"check failed: (m",0x10);
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_80 = 0;
            uStack_78 = 0x5938;
            local_70 = 0;
            pcStack_68 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_60 = 0x65;
            LVar8.super_LineCol.col = 0;
            LVar8.super_LineCol.offset = SUB168(ZEXT816(0x5938) << 0x40,0);
            LVar8.super_LineCol.line = SUB168(ZEXT816(0x5938) << 0x40,8);
            LVar8.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar8.name.len = 0x65;
            (*(this->m_tree->m_callbacks).m_error)
                      (local_138,0x2c,LVar8,(this->m_tree->m_callbacks).m_user_data);
          }
          NVar14 = Tree::type(this->m_tree,sVar12);
          if (((uint)NVar14.type >> 0xe & 1) != 0) {
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              std::ostream::put((char)(this->
                                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream + '\x10');
            }
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + lVar15;
            std::ostream::write((char *)((this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + 0x10),0x20fa95);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 2;
            _do_visit_flow_sl(this,sVar12,0);
            goto LAB_0018ace8;
          }
          if ((short)NVar14.type < 0) {
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              std::ostream::put((char)(this->
                                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream + '\x10');
            }
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + lVar15;
            std::ostream::write((char *)((this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + 0x10),0x20fa95);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 2;
            _do_visit_flow_ml(this,sVar12,local_108,do_indent);
            goto LAB_0018ace8;
          }
          _do_visit_block(this,sVar12,local_108,do_indent);
        }
        sVar12 = Tree::next_sibling(this->m_tree,sVar12);
        do_indent = 1;
        lVar15 = local_100;
      } while (sVar12 != 0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_block_container(size_t node, size_t next_level, size_t do_indent)
{
    RepC ind = indent_to(do_indent * next_level);

    if(m_tree->is_seq(node))
    {
        for(size_t child = m_tree->first_child(node); child != NONE; child = m_tree->next_sibling(child))
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), !m_tree->has_key(child));
            if(m_tree->is_val(child))
            {
                this->Writer::_do_write(ind);
                this->Writer::_do_write("- ");
                _writev(child, next_level);
                this->Writer::_do_write('\n');
            }
            else
            {
                _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_container(child));
                NodeType ty = m_tree->type(child);
                if(ty.marked_flow_sl())
                {
                    this->Writer::_do_write(ind);
                    this->Writer::_do_write("- ");
                    _do_visit_flow_sl(child, 0u);
                    this->Writer::_do_write('\n');
                }
                else if(ty.marked_flow_ml())
                {
                    this->Writer::_do_write(ind);
                    this->Writer::_do_write("- ");
                    _do_visit_flow_ml(child, next_level, do_indent);
                    this->Writer::_do_write('\n');
                }
                else
                {
                    _do_visit_block(child, next_level, do_indent);
                }
            }
            do_indent = true;
            ind = indent_to(do_indent * next_level);
        }
    }
    else // map
    {
        _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_map(node));
        for(size_t ich = m_tree->first_child(node); ich != NONE; ich = m_tree->next_sibling(ich))
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->has_key(ich));
            if(m_tree->is_keyval(ich))
            {
                this->Writer::_do_write(ind);
                _writek(ich, next_level);
                this->Writer::_do_write(": ");
                _writev(ich, next_level);
                this->Writer::_do_write('\n');
            }
            else
            {
                _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_container(ich));
                NodeType ty = m_tree->type(ich);
                if(ty.marked_flow_sl())
                {
                    this->Writer::_do_write(ind);
                    _do_visit_flow_sl(ich, 0u);
                    this->Writer::_do_write('\n');
                }
                else if(ty.marked_flow_ml())
                {
                    this->Writer::_do_write(ind);
                    _do_visit_flow_ml(ich, 0u);
                    this->Writer::_do_write('\n');
                }
                else
                {
                    _do_visit_block(ich, next_level, do_indent);
                }
            }
            do_indent = true;
            ind = indent_to(do_indent * next_level);
        }
    }
}